

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O0

void If_LibLutPrint(If_LibLut_t *pLutLib)

{
  int local_18;
  uint local_14;
  int k;
  int i;
  If_LibLut_t *pLutLib_local;
  
  Abc_Print(1,"# The area/delay of k-variable LUTs:\n");
  Abc_Print(1,"# k    area     delay\n");
  if (pLutLib->fVarPinDelays == 0) {
    for (local_14 = 1; (int)local_14 <= pLutLib->LutMax; local_14 = local_14 + 1) {
      Abc_Print(1,"%d   %7.2f   %7.2f\n",(double)pLutLib->pLutAreas[(int)local_14],
                (double)pLutLib->pLutDelays[(int)local_14][0],(ulong)local_14);
    }
  }
  else {
    for (local_14 = 1; (int)local_14 <= pLutLib->LutMax; local_14 = local_14 + 1) {
      Abc_Print(1,"%d   %7.2f  ",(double)pLutLib->pLutAreas[(int)local_14],(ulong)local_14);
      for (local_18 = 0; local_18 < (int)local_14; local_18 = local_18 + 1) {
        Abc_Print(1," %7.2f",(double)pLutLib->pLutDelays[(int)local_14][local_18]);
      }
      Abc_Print(1,"\n");
    }
  }
  return;
}

Assistant:

void If_LibLutPrint( If_LibLut_t * pLutLib )
{
    int i, k;
    Abc_Print( 1, "# The area/delay of k-variable LUTs:\n" );
    Abc_Print( 1, "# k    area     delay\n" );
    if ( pLutLib->fVarPinDelays )
    {
        for ( i = 1; i <= pLutLib->LutMax; i++ )
        {
            Abc_Print( 1, "%d   %7.2f  ", i, pLutLib->pLutAreas[i] );
            for ( k = 0; k < i; k++ )
                Abc_Print( 1, " %7.2f", pLutLib->pLutDelays[i][k] );
            Abc_Print( 1, "\n" );
        }
    }
    else
        for ( i = 1; i <= pLutLib->LutMax; i++ )
            Abc_Print( 1, "%d   %7.2f   %7.2f\n", i, pLutLib->pLutAreas[i], pLutLib->pLutDelays[i][0] );
}